

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_handle_new_session_ticket(ptls_t *tls,ptls_iovec_t message)

{
  ushort uVar1;
  st_ptls_get_time_t *psVar2;
  st_ptls_save_ticket_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  uint8_t *puVar9;
  int iVar10;
  ptls_iovec_t pVar11;
  ptls_buffer_t ticket_buf;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  ptls_iovec_t ticket_nonce;
  uint8_t ticket_buf_small [512];
  
  puVar9 = message.base + 4;
  iVar6 = decode_new_session_ticket
                    (tls,(uint32_t *)&ticket_buf,&ticket_age_add,&ticket_nonce,
                     (ptls_iovec_t *)ticket_buf_small,&max_early_data_size,puVar9,
                     message.base + message.len);
  if (iVar6 == 0) {
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      iVar6 = 0;
    }
    else {
      ticket_buf.off = 0;
      ticket_buf.capacity = 0x200;
      ticket_buf._24_8_ = (ulong)(uint)ticket_buf._28_4_ << 0x20;
      psVar2 = tls->ctx->get_time;
      ticket_buf.base = ticket_buf_small;
      uVar7 = (*psVar2->cb)(psVar2);
      iVar6 = ptls_buffer_reserve(&ticket_buf,8);
      if (iVar6 == 0) {
        *(uint64_t *)(ticket_buf.base + ticket_buf.off) =
             uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        ticket_buf.off = ticket_buf.off + 8;
        iVar6 = 0;
      }
      if (iVar6 == 0) {
        uVar1 = tls->key_share->id;
        iVar6 = ptls_buffer_reserve(&ticket_buf,2);
        if (iVar6 == 0) {
          *(ushort *)(ticket_buf.base + ticket_buf.off) = uVar1 << 8 | uVar1 >> 8;
          ticket_buf.off = ticket_buf.off + 2;
          iVar6 = 0;
        }
        if (iVar6 == 0) {
          uVar1 = tls->cipher_suite->id;
          iVar6 = ptls_buffer_reserve(&ticket_buf,2);
          if (iVar6 == 0) {
            *(ushort *)(ticket_buf.base + ticket_buf.off) = uVar1 << 8 | uVar1 >> 8;
            ticket_buf.off = ticket_buf.off + 2;
            iVar6 = 0;
          }
          if (iVar6 == 0) {
            iVar6 = ptls_buffer_reserve(&ticket_buf,3);
            if (iVar6 == 0) {
              ticket_buf.base[ticket_buf.off + 2] = '\0';
              (ticket_buf.base + ticket_buf.off)[0] = '\0';
              (ticket_buf.base + ticket_buf.off)[1] = '\0';
              ticket_buf.off = ticket_buf.off + 3;
              iVar6 = 0;
            }
            sVar4 = ticket_buf.off;
            iVar10 = 6;
            if ((iVar6 == 0) &&
               (iVar6 = ptls_buffer__do_pushv(&ticket_buf,puVar9,message.len - 4), iVar10 = 6,
               iVar6 == 0)) {
              puVar9 = ticket_buf.base + (sVar4 - 3);
              lVar8 = 0x10;
              do {
                *puVar9 = (uint8_t)(ticket_buf.off - sVar4 >> ((byte)lVar8 & 0x3f));
                lVar8 = lVar8 + -8;
                puVar9 = puVar9 + 1;
              } while (lVar8 != -8);
              iVar10 = 0;
            }
            if (iVar10 != 6) {
              if (iVar10 != 0) {
                return 0;
              }
              iVar6 = ptls_buffer_reserve(&ticket_buf,2);
              if (iVar6 == 0) {
                (ticket_buf.base + ticket_buf.off)[0] = '\0';
                (ticket_buf.base + ticket_buf.off)[1] = '\0';
                ticket_buf.off = ticket_buf.off + 2;
                iVar6 = 0;
              }
              sVar4 = ticket_buf.off;
              iVar10 = 6;
              if (((iVar6 == 0) &&
                  (iVar6 = ptls_buffer_reserve(&ticket_buf,
                                               (tls->key_schedule->hashes[0].algo)->digest_size),
                  sVar5 = ticket_buf.off, puVar9 = ticket_buf.base, iVar6 == 0)) &&
                 (iVar6 = derive_resumption_secret
                                    (tls->key_schedule,ticket_buf.base + ticket_buf.off,ticket_nonce
                                    ), iVar10 = 6, iVar6 == 0)) {
                ticket_buf.off = sVar5 + (tls->key_schedule->hashes[0].algo)->digest_size;
                puVar9 = puVar9 + (sVar4 - 2);
                lVar8 = 8;
                do {
                  *puVar9 = (uint8_t)(ticket_buf.off - sVar4 >> ((byte)lVar8 & 0x3f));
                  lVar8 = lVar8 + -8;
                  puVar9 = puVar9 + 1;
                } while (lVar8 != -8);
                iVar6 = 0;
                iVar10 = 0;
              }
              if (iVar10 != 6) {
                if (iVar10 != 0) {
                  return 0;
                }
                psVar3 = tls->ctx->save_ticket;
                pVar11.len = ticket_buf.off;
                pVar11.base = ticket_buf.base;
                iVar6 = (*psVar3->cb)(psVar3,tls,pVar11);
              }
            }
          }
        }
      }
      puVar9 = ticket_buf.base;
      (*ptls_clear_memory)(ticket_buf.base,ticket_buf.off);
      if (ticket_buf.is_allocated != 0) {
        free(puVar9);
      }
    }
  }
  return iVar6;
}

Assistant:

static int client_handle_new_session_ticket(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    ptls_iovec_t ticket_nonce;
    int ret;

    { /* verify the format */
        uint32_t ticket_lifetime, ticket_age_add, max_early_data_size;
        ptls_iovec_t ticket;
        if ((ret = decode_new_session_ticket(tls, &ticket_lifetime, &ticket_age_add, &ticket_nonce, &ticket, &max_early_data_size,
                                             src, end)) != 0)
            return ret;
    }

    /* do nothing if use of session ticket is disabled */
    if (tls->ctx->save_ticket == NULL)
        return 0;

    /* save the extension, along with the key of myself */
    ptls_buffer_t ticket_buf;
    uint8_t ticket_buf_small[512];
    ptls_buffer_init(&ticket_buf, ticket_buf_small, sizeof(ticket_buf_small));
    ptls_buffer_push64(&ticket_buf, tls->ctx->get_time->cb(tls->ctx->get_time));
    ptls_buffer_push16(&ticket_buf, tls->key_share->id);
    ptls_buffer_push16(&ticket_buf, tls->cipher_suite->id);
    ptls_buffer_push_block(&ticket_buf, 3, { ptls_buffer_pushv(&ticket_buf, src, end - src); });
    ptls_buffer_push_block(&ticket_buf, 2, {
        if ((ret = ptls_buffer_reserve(&ticket_buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = derive_resumption_secret(tls->key_schedule, ticket_buf.base + ticket_buf.off, ticket_nonce)) != 0)
            goto Exit;
        ticket_buf.off += tls->key_schedule->hashes[0].algo->digest_size;
    });

    if ((ret = tls->ctx->save_ticket->cb(tls->ctx->save_ticket, tls, ptls_iovec_init(ticket_buf.base, ticket_buf.off))) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&ticket_buf);
    return ret;
}